

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O2

void __thiscall
QStandardItemPrivate::setItemData(QStandardItemPrivate *this,QMap<int,_QVariant> *roles)

{
  QList<QStandardItemData> *this_00;
  QStandardItem *item;
  long lVar1;
  Data *pDVar2;
  bool bVar3;
  bool bVar4;
  compare_eq_result_container<QList<QStandardItemData>,_QStandardItemData> cVar5;
  int iVar6;
  iterator iVar7;
  iterator iVar8;
  ulong uVar9;
  _Base_ptr p_Var10;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar11;
  _Rb_tree_node_base *p_Var12;
  _Rb_tree_color _Var13;
  _Rb_tree_node_base *p_Var14;
  _Rb_tree_color _Var15;
  const_iterator __last;
  parameter_type t;
  qsizetype qVar16;
  iterator __i;
  QStandardItemData *pQVar17;
  const_iterator __first;
  bool bVar18;
  long in_FS_OFFSET;
  QArrayDataPointer<QStandardItemData> local_98;
  pair<const_int_&,_const_QVariant_&> local_78;
  QStandardItemData local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  item = this->q_ptr;
  this_00 = &this->values;
  iVar7 = QList<QStandardItemData>::begin(this_00);
  iVar8 = QList<QStandardItemData>::end(this_00);
  if (iVar7.i != iVar8.i) {
    uVar9 = ((long)iVar8.i - (long)iVar7.i) / 0x28;
    lVar1 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<QList<QStandardItemData>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<QStandardItemPrivate::setItemData(QMap<int,QVariant>const&)::__0>>
              (iVar7.i,iVar8.i,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)iVar8.i - (long)iVar7.i < 0x281) {
      std::
      __insertion_sort<QList<QStandardItemData>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QStandardItemPrivate::setItemData(QMap<int,QVariant>const&)::__0>>
                (iVar7.i,iVar8.i);
    }
    else {
      pQVar17 = iVar7.i + 0x10;
      std::
      __insertion_sort<QList<QStandardItemData>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QStandardItemPrivate::setItemData(QMap<int,QVariant>const&)::__0>>
                (iVar7.i,pQVar17);
      for (; pQVar17 != iVar8.i; pQVar17 = pQVar17 + 1) {
        std::
        __unguarded_linear_insert<QList<QStandardItemData>::iterator,__gnu_cxx::__ops::_Val_comp_iter<QStandardItemPrivate::setItemData(QMap<int,QVariant>const&)::__0>>
                  (pQVar17);
      }
    }
  }
  local_98.d = (Data *)0x0;
  local_98.ptr = (QStandardItemData *)0x0;
  local_98.size = 0;
  QList<QStandardItemData>::reserve((QList<QStandardItemData> *)&local_98,(this->values).d.size);
  pQVar11 = (roles->d).d.ptr;
  if (pQVar11 ==
      (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
       *)0x0) {
    p_Var10 = (_Base_ptr)0x0;
  }
  else {
    p_Var10 = *(_Base_ptr *)
               ((long)&(pQVar11->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var12 = &(pQVar11->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar11 ==
      (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
       *)0x0) {
    p_Var12 = (_Rb_tree_node_base *)0x0;
  }
  __first.i = (this->values).d.ptr;
  __last.i = __first.i + (this->values).d.size;
LAB_004c1ff1:
  if (p_Var10 == p_Var12) {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<QList<QStandardItemData>::const_iterator,std::back_insert_iterator<QList<QStandardItemData>>>
              (__first,__last,(QList<QStandardItemData> *)&local_98);
  }
  else {
    if (__first.i != __last.i) goto code_r0x004c2003;
    for (; p_Var10 != p_Var12; p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
      if (3 < *(ulong *)(p_Var10 + 2)) {
        local_78.second = (QVariant *)&p_Var10[1]._M_parent;
        local_78.first = (int *)(p_Var10 + 1);
        QStandardItemData::QStandardItemData(&local_68,&local_78);
        QList<QStandardItemData>::emplaceBack<QStandardItemData>
                  ((QList<QStandardItemData> *)&local_98,&local_68);
        ::QVariant::~QVariant(&local_68.value);
      }
    }
  }
  cVar5 = QList<QStandardItemData>::operator!=((QList<QStandardItemData> *)&local_98,this_00);
  if (!cVar5) goto LAB_004c2232;
  pDVar2 = (this->values).d.d;
  pQVar17 = (this->values).d.ptr;
  (this->values).d.d = local_98.d;
  (this->values).d.ptr = local_98.ptr;
  qVar16 = (this->values).d.size;
  (this->values).d.size = local_98.size;
  local_98.d = pDVar2;
  local_98.ptr = pQVar17;
  local_98.size = qVar16;
  if (this->model == (QStandardItemModel *)0x0) goto LAB_004c2232;
  local_68.value.d.data._8_8_ = 0;
  local_68.role = 0;
  local_68._4_4_ = 0;
  local_68.value.d.data.shared = (PrivateShared *)0x0;
  pQVar11 = (roles->d).d.ptr;
  if (pQVar11 ==
      (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
       *)0x0) {
    qVar16 = 1;
  }
  else {
    qVar16 = (pQVar11->m)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
  }
  QList<int>::reserve((QList<int> *)&local_68,qVar16);
  pQVar11 = (roles->d).d.ptr;
  if (pQVar11 ==
      (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
       *)0x0) {
    p_Var12 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var12 = *(_Base_ptr *)
               ((long)&(pQVar11->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  bVar3 = false;
  bVar18 = false;
  while( true ) {
    p_Var14 = &(pQVar11->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar11 ==
        (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
         *)0x0) {
      p_Var14 = (_Rb_tree_node_base *)0x0;
    }
    if (p_Var12 == p_Var14) break;
    QList<int>::append((QList<int> *)&local_68,p_Var12[1]._M_color);
    _Var13 = p_Var12[1]._M_color;
    bVar4 = bVar3;
    if (_Var13 == _S_red) {
      bVar4 = true;
    }
    if (_Var13 == 2) {
      bVar4 = bVar3;
    }
    bVar3 = bVar4;
    bVar18 = (bool)(bVar18 | _Var13 == 2);
    p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    pQVar11 = (roles->d).d.ptr;
  }
  if (bVar18) {
    t = 0;
    if (!bVar3) {
LAB_004c2203:
      QList<int>::append((QList<int> *)&local_68,t);
    }
  }
  else if (bVar3) {
    t = 2;
    goto LAB_004c2203;
  }
  QStandardItemModelPrivate::itemChanged
            (*(QStandardItemModelPrivate **)&this->model->field_0x8,item,(QList<int> *)&local_68);
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_68);
LAB_004c2232:
  QArrayDataPointer<QStandardItemData>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
code_r0x004c2003:
  iVar6 = (__first.i)->role;
  _Var13 = p_Var10[1]._M_color;
  _Var15 = _Var13;
  if (_Var13 == 2) {
    _Var15 = _S_red;
  }
  if (iVar6 < (int)_Var15) {
    QList<QStandardItemData>::emplaceBack<QStandardItemData_const&>
              ((QList<QStandardItemData> *)&local_98,__first.i);
    __first.i = __first.i + 1;
  }
  else {
    if (3 < *(ulong *)(p_Var10 + 2)) {
      local_78.second = (QVariant *)&p_Var10[1]._M_parent;
      local_78.first = (int *)(p_Var10 + 1);
      QStandardItemData::QStandardItemData(&local_68,&local_78);
      QList<QStandardItemData>::emplaceBack<QStandardItemData>
                ((QList<QStandardItemData> *)&local_98,&local_68);
      ::QVariant::~QVariant(&local_68.value);
      _Var13 = p_Var10[1]._M_color;
      iVar6 = (__first.i)->role;
    }
    if (_Var13 == 2) {
      _Var13 = _S_red;
    }
    if (iVar6 <= (int)_Var13) {
      __first.i = __first.i + 1;
    }
    p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
  }
  goto LAB_004c1ff1;
}

Assistant:

void QStandardItemPrivate::setItemData(const QMap<int, QVariant> &roles)
{
    Q_Q(QStandardItem);

    auto byRole = [](const QStandardItemData& item1, const QStandardItemData& item2) {
        return item1.role < item2.role;
    };

    std::sort(values.begin(), values.end(), byRole);

    /*
        Create a list of QStandardItemData that will contain the original values
        if the matching role is not contained in roles, the new value if it is and
        if the new value is an invalid QVariant, it will be removed.
    */
    QList<QStandardItemData> newValues;
    newValues.reserve(values.size());
    roleMapStandardItemDataUnion(roles.keyValueBegin(),
                                 roles.keyValueEnd(),
                                 values.cbegin(), values.cend(),
                                 std::back_inserter(newValues), ByNormalizedRole());

    if (newValues != values) {
        values.swap(newValues);
        if (model) {
            QList<int> roleKeys;
            roleKeys.reserve(roles.size() + 1);
            bool hasEditRole = false;
            bool hasDisplayRole = false;
            for (auto it = roles.keyBegin(); it != roles.keyEnd(); ++it) {
                roleKeys.push_back(*it);
                if (*it == Qt::EditRole)
                    hasEditRole = true;
                else if (*it == Qt::DisplayRole)
                    hasDisplayRole = true;
            }
            if (hasEditRole && !hasDisplayRole)
                roleKeys.push_back(Qt::DisplayRole);
            else if (!hasEditRole && hasDisplayRole)
                roleKeys.push_back(Qt::EditRole);
            model->d_func()->itemChanged(q, roleKeys);
        }
    }
}